

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O0

vec2 __thiscall rengine::SDLBackend::dpi(SDLBackend *this)

{
  uint uVar1;
  vec2 vVar2;
  vec2 local_30;
  float local_28;
  float local_24;
  float v;
  float h;
  float d;
  int index;
  SDLBackend *this_local;
  
  _d = this;
  if (this->m_window == (SDL_Window *)0x0) {
    __assert_fail("m_window",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x112,"virtual vec2 rengine::SDLBackend::dpi() const");
  }
  if (this->m_surface != (Surface *)0x0) {
    h = (float)SDL_GetWindowDisplayIndex(this->m_window);
    SDL_GetDisplayDPI(h,&v,&local_24,&local_28);
    vec2::vec2(&local_30,local_24,local_28);
    uVar1 = devicePixelRatio(this);
    vVar2 = vec2::operator*(&local_30,(float)uVar1);
    return vVar2;
  }
  __assert_fail("m_surface",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                ,0x113,"virtual vec2 rengine::SDLBackend::dpi() const");
}

Assistant:

inline vec2 SDLBackend::dpi() const
{
    assert(m_window);
    assert(m_surface);
    int index = SDL_GetWindowDisplayIndex(m_window);
    float d, h, v;
    SDL_GetDisplayDPI(index, &d, &h, &v);
    return vec2(h, v) * devicePixelRatio();
}